

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_passphrase.c
# Opt level: O1

int archive_write_set_passphrase_callback
              (archive *_a,void *client_data,archive_passphrase_callback *cb)

{
  int iVar1;
  int iVar2;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_passphrase_callback");
  iVar2 = -0x1e;
  if (iVar1 != -0x1e) {
    *(archive_passphrase_callback **)&_a[2].archive_format = cb;
    _a[2].archive_format_name = (char *)client_data;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
archive_write_set_passphrase_callback(struct archive *_a, void *client_data,
    archive_passphrase_callback *cb)
{
	struct archive_write *a = (struct archive_write *)_a;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC, ARCHIVE_STATE_NEW,
		"archive_write_set_passphrase_callback");

	a->passphrase_callback = cb;
	a->passphrase_client_data = client_data;
	return (ARCHIVE_OK);
}